

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

string * common_chat_format_example_abi_cxx11_
                   (string *__return_storage_ptr__,common_chat_templates *tmpls,bool use_jinja)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_class_8_1_5a939327 add_simple_msg;
  common_chat_templates_inputs *local_150;
  common_chat_templates_inputs local_148;
  common_chat_params local_c0;
  
  paVar1 = &local_148.grammar.field_2;
  local_148.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.grammar._M_string_length = 0;
  local_148.grammar.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_148.json_schema.field_2;
  local_148.json_schema._M_string_length = 0;
  local_148.json_schema.field_2._M_local_buf[0] = '\0';
  local_148.add_generation_prompt = true;
  local_148.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_finish._0_5_ = 0;
  local_148.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_finish._5_3_ = 0;
  local_148.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
  local_148._117_8_ = 0;
  local_148.extract_reasoning = true;
  local_150 = &local_148;
  local_148.grammar._M_dataplus._M_p = (pointer)paVar1;
  local_148.json_schema._M_dataplus._M_p = (pointer)paVar2;
  local_148.use_jinja = use_jinja;
  common_chat_format_example[abi:cxx11](common_chat_templates_const*,bool)::$_0::operator()
            (&local_150,"system","You are a helpful assistant");
  common_chat_format_example[abi:cxx11](common_chat_templates_const*,bool)::$_0::operator()
            (&local_150,"user","Hello");
  common_chat_format_example[abi:cxx11](common_chat_templates_const*,bool)::$_0::operator()
            (&local_150,"assistant","Hi there");
  common_chat_format_example[abi:cxx11](common_chat_templates_const*,bool)::$_0::operator()
            (&local_150,"user","How are you?");
  common_chat_templates_apply(&local_c0,tmpls,&local_148);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  paVar3 = &local_c0.prompt.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.prompt._M_dataplus._M_p == paVar3) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_c0.prompt.field_2._M_allocated_capacity._1_7_,
                  local_c0.prompt.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_c0.prompt.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_c0.prompt._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_c0.prompt.field_2._M_allocated_capacity._1_7_,
                  local_c0.prompt.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_c0.prompt._M_string_length;
  local_c0.prompt._M_string_length = 0;
  local_c0.prompt.field_2._M_local_buf[0] = '\0';
  local_c0.prompt._M_dataplus._M_p = (pointer)paVar3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0.additional_stops);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0.preserved_tokens);
  std::vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>::~vector
            (&local_c0.grammar_triggers);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.grammar._M_dataplus._M_p != &local_c0.grammar.field_2) {
    operator_delete(local_c0.grammar._M_dataplus._M_p,
                    local_c0.grammar.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.prompt._M_dataplus._M_p != paVar3) {
    operator_delete(local_c0.prompt._M_dataplus._M_p,
                    CONCAT71(local_c0.prompt.field_2._M_allocated_capacity._1_7_,
                             local_c0.prompt.field_2._M_local_buf[0]) + 1);
  }
  std::vector<common_chat_tool,_std::allocator<common_chat_tool>_>::~vector(&local_148.tools);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.json_schema._M_dataplus._M_p != paVar2) {
    operator_delete(local_148.json_schema._M_dataplus._M_p,
                    CONCAT71(local_148.json_schema.field_2._M_allocated_capacity._1_7_,
                             local_148.json_schema.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.grammar._M_dataplus._M_p != paVar1) {
    operator_delete(local_148.grammar._M_dataplus._M_p,
                    CONCAT71(local_148.grammar.field_2._M_allocated_capacity._1_7_,
                             local_148.grammar.field_2._M_local_buf[0]) + 1);
  }
  std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::~vector(&local_148.messages);
  return __return_storage_ptr__;
}

Assistant:

std::string common_chat_format_example(const struct common_chat_templates * tmpls, bool use_jinja) {
    common_chat_templates_inputs inputs;
    inputs.use_jinja = use_jinja;
    auto add_simple_msg = [&](auto role, auto content) {
        common_chat_msg msg;
        msg.role = role;
        msg.content = content;
        inputs.messages.push_back(msg);
    };
    add_simple_msg("system",    "You are a helpful assistant");
    add_simple_msg("user",      "Hello");
    add_simple_msg("assistant", "Hi there");
    add_simple_msg("user",      "How are you?");
    return common_chat_templates_apply(tmpls, inputs).prompt;
}